

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true> __thiscall
duckdb::ConstructInitialGrouping
          (duckdb *this,PivotRef *ref,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *all_columns,case_insensitive_set_t *handled_columns)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var2;
  pointer pcVar3;
  duckdb *pdVar4;
  int iVar5;
  SelectNode *this_00;
  pointer pSVar6;
  pointer pSVar7;
  ConstantExpression *pCVar8;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  this_01;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> extraout_RAX;
  undefined4 extraout_var;
  type root_expr;
  ColumnRefExpression *pCVar9;
  string *psVar10;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  _Var11;
  __node_type *extraout_RAX_00;
  undefined4 extraout_var_00;
  InternalException *this_02;
  pointer *__ptr_2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var12;
  pointer this_03;
  optional_ptr<duckdb::ParsedExpression,_true> column_entry;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_d8;
  duckdb *local_d0;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_c8;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_c0;
  Value local_b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_78;
  Value local_70;
  
  local_78 = &handled_columns->_M_h;
  this_00 = (SelectNode *)operator_new(0xf0);
  SelectNode::SelectNode(this_00);
  *(SelectNode **)this = this_00;
  pSVar6 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::operator->
                     ((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                       *)this);
  _Var1._M_head_impl =
       (ref->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t
       .super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (ref->source).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
  _Var2._M_head_impl =
       (pSVar6->from_table).
       super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pSVar6->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
  _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var1._M_head_impl;
  local_d0 = this;
  if (_Var2._M_head_impl != (TableRef *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableRef + 8))();
  }
  _Var12._M_head_impl =
       (SelectNode *)
       (ref->groups).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var11._M_cur =
       (__node_type *)
       (ref->groups).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var12._M_head_impl == (SelectNode *)_Var11._M_cur) {
    this_03 = (all_columns->
              super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    _Var12._M_head_impl =
         (SelectNode *)
         (all_columns->
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c0._M_head_impl = _Var12._M_head_impl;
    if ((SelectNode *)this_03 != _Var12._M_head_impl) {
      do {
        root_expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(this_03);
        local_d8._M_head_impl = (ParsedExpression *)Binder::GetResolvedColumnExpression(root_expr);
        pdVar4 = local_d0;
        if (local_d8._M_head_impl == (ParsedExpression *)0x0) {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          local_b8.type_._0_8_ = (long)&local_b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,"Unexpected child of pivot source - not a ColumnRef","");
          InternalException::InternalException(this_02,(string *)&local_b8);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb::ParsedExpression,_true>::CheckValid
                  ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_d8);
        pCVar9 = BaseExpression::Cast<duckdb::ColumnRefExpression>
                           (&(local_d8._M_head_impl)->super_BaseExpression);
        psVar10 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar9);
        _Var11._M_cur =
             (__node_type *)
             ::std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             ::find(local_78,psVar10);
        if (_Var11._M_cur == (__node_type *)0x0) {
          pSVar6 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)pdVar4);
          pSVar7 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)pdVar4);
          Value::INTEGER(&local_70,
                         (int)((ulong)((long)(pSVar7->select_list).
                                             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                             .
                                             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pSVar7->select_list).
                                            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            .
                                            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
          pCVar8 = (ConstantExpression *)operator_new(0x78);
          Value::Value(&local_b8,&local_70);
          ConstantExpression::ConstantExpression(pCVar8,&local_b8);
          Value::~Value(&local_b8);
          local_c8._M_head_impl = (ParsedExpression *)pCVar8;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar6->groups,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_c8);
          _Var12._M_head_impl = local_c0._M_head_impl;
          if ((ConstantExpression *)local_c8._M_head_impl != (ConstantExpression *)0x0) {
            (*((BaseExpression *)
              &((local_c8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          local_c8._M_head_impl = (ParsedExpression *)0x0;
          Value::~Value(&local_70);
          pSVar6 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                   operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                               *)pdVar4);
          psVar10 = ColumnRefExpression::GetColumnName_abi_cxx11_(pCVar9);
          pCVar9 = (ColumnRefExpression *)operator_new(0x50);
          local_b8.type_._0_8_ = (long)&local_b8 + 0x10;
          pcVar3 = (psVar10->_M_dataplus)._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pcVar3,pcVar3 + psVar10->_M_string_length);
          ColumnRefExpression::ColumnRefExpression(pCVar9,(string *)&local_b8);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_b8.type_._0_8_ !=
              (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_b8 + 0x10U)) {
            operator_delete((void *)local_b8.type_._0_8_);
          }
          local_70.type_._0_8_ = pCVar9;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&pSVar6->select_list,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_70);
          _Var11._M_cur = extraout_RAX_00;
          if ((ColumnRefExpression *)local_70.type_._0_8_ != (ColumnRefExpression *)0x0) {
            iVar5 = (*((BaseExpression *)
                      &((BaseExpression *)local_70.type_._0_8_)->_vptr_BaseExpression)->
                      _vptr_BaseExpression[1])();
            _Var11._M_cur = (__node_type *)CONCAT44(extraout_var_00,iVar5);
          }
        }
        this_03 = this_03 + 1;
      } while ((SelectNode *)this_03 != _Var12._M_head_impl);
    }
  }
  else {
    local_c0._M_head_impl = (SelectNode *)_Var11._M_cur;
    do {
      pdVar4 = local_d0;
      pSVar6 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)local_d0);
      pSVar7 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)pdVar4);
      Value::INTEGER(&local_70,
                     (int)((ulong)((long)(pSVar7->select_list).
                                         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                         .
                                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pSVar7->select_list).
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
      pCVar8 = (ConstantExpression *)operator_new(0x78);
      Value::Value(&local_b8,&local_70);
      ConstantExpression::ConstantExpression(pCVar8,&local_b8);
      Value::~Value(&local_b8);
      local_d8._M_head_impl = (ParsedExpression *)pCVar8;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar6->groups,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_d8);
      if ((ConstantExpression *)local_d8._M_head_impl != (ConstantExpression *)0x0) {
        (*((BaseExpression *)&((local_d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      local_d8._M_head_impl = (ParsedExpression *)0x0;
      Value::~Value(&local_70);
      pSVar6 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
               operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                           *)local_d0);
      this_01.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)operator_new(0x50);
      local_b8.type_._0_8_ = (long)&local_b8 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,*(long *)_Var12._M_head_impl,
                 *(long *)((long)_Var12._M_head_impl + 8) + *(long *)_Var12._M_head_impl);
      ColumnRefExpression::ColumnRefExpression
                ((ColumnRefExpression *)
                 this_01.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl,
                 (string *)&local_b8);
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_b8.type_._0_8_ !=
          (__shared_count<(__gnu_cxx::_Lock_policy)2> **)((long)&local_b8 + 0x10U)) {
        operator_delete((void *)local_b8.type_._0_8_);
      }
      local_70.type_._0_8_ =
           this_01.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar6->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_70);
      _Var11._M_cur = (__node_type *)extraout_RAX._M_head_impl;
      if ((tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
          local_70.type_._0_8_ != (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
        _Var11._M_cur._0_4_ =
             (*(((ParsedExpression *)local_70.type_._0_8_)->super_BaseExpression).
               _vptr_BaseExpression[1])();
        _Var11._M_cur._4_4_ = extraout_var;
      }
      _Var12._M_head_impl = _Var12._M_head_impl + 0x20;
    } while (_Var12._M_head_impl != local_c0._M_head_impl);
  }
  return (unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>)
         _Var11._M_cur;
}

Assistant:

static unique_ptr<SelectNode> ConstructInitialGrouping(PivotRef &ref, vector<unique_ptr<ParsedExpression>> all_columns,
                                                       const case_insensitive_set_t &handled_columns) {
	auto subquery = make_uniq<SelectNode>();
	subquery->from_table = std::move(ref.source);
	if (ref.groups.empty()) {
		// if rows are not specified any columns that are not pivoted/aggregated on are added to the GROUP BY clause
		for (auto &entry : all_columns) {
			auto column_entry = Binder::GetResolvedColumnExpression(*entry);
			if (!column_entry) {
				throw InternalException("Unexpected child of pivot source - not a ColumnRef");
			}
			auto &columnref = column_entry->Cast<ColumnRefExpression>();
			if (handled_columns.find(columnref.GetColumnName()) == handled_columns.end()) {
				// not handled - add to grouping set
				subquery->groups.group_expressions.push_back(make_uniq<ConstantExpression>(
				    Value::INTEGER(UnsafeNumericCast<int32_t>(subquery->select_list.size() + 1))));
				subquery->select_list.push_back(make_uniq<ColumnRefExpression>(columnref.GetColumnName()));
			}
		}
	} else {
		// if rows are specified only the columns mentioned in rows are added as groups
		for (auto &row : ref.groups) {
			subquery->groups.group_expressions.push_back(make_uniq<ConstantExpression>(
			    Value::INTEGER(UnsafeNumericCast<int32_t>(subquery->select_list.size() + 1))));
			subquery->select_list.push_back(make_uniq<ColumnRefExpression>(row));
		}
	}
	return subquery;
}